

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings(SimpleParallelAnalyzerSettings *this)

{
  Channel *pCVar1;
  size_type sVar2;
  reference ppAVar3;
  element_type *peVar4;
  uint local_18;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *this_local;
  
  sVar2 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  for (local_18 = 0; local_18 < (uint)sVar2; local_18 = local_18 + 1) {
    ppAVar3 = std::
              vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
              ::operator[](&this->mDataChannelsInterface,(ulong)local_18);
    pCVar1 = (Channel *)*ppAVar3;
    std::vector<Channel,_std::allocator<Channel>_>::operator[](&this->mDataChannels,(ulong)local_18)
    ;
    AnalyzerSettingInterfaceChannel::SetChannel(pCVar1);
  }
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar4);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockEdge);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings()
{
	U32 count = (U32)mDataChannels.size();
	for( U32 i=0; i<count; i++ )
	{
		mDataChannelsInterface[i]->SetChannel( mDataChannels[i] );
	}

	mClockChannelInterface->SetChannel( mClockChannel );
	mClockEdgeInterface->SetNumber( mClockEdge );
}